

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

int __thiscall H264StreamReader::processSEI(H264StreamReader *this,uint8_t *buff)

{
  uint8_t **ppuVar1;
  uint8_t *puVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint8_t *end;
  __node_base _Var8;
  undefined4 *puVar9;
  SEIUnit lastSEI;
  ostringstream ss;
  uint8_t tmpBuff [3072];
  uint *local_f90;
  undefined8 local_f88;
  uint local_f80;
  undefined4 uStack_f7c;
  undefined4 uStack_f78;
  undefined4 uStack_f74;
  uint *local_f70;
  undefined8 local_f68;
  uint local_f60;
  undefined4 uStack_f5c;
  undefined4 uStack_f58;
  undefined4 uStack_f54;
  SEIUnit local_f50;
  ostringstream local_db0 [376];
  uint8_t local_c38 [3072];
  uint8_t local_38 [8];
  
  if ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_f50.m_processedMessages._M_h._M_buckets =
         &local_f50.m_processedMessages._M_h._M_single_bucket;
    local_f50.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
    local_f50.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
    local_f50.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
    local_f50.super_NALUnit.bitReader.m_curVal = 0;
    local_f50.super_NALUnit.bitReader.m_bitLeft = 0;
    local_f50.super_NALUnit.nal_unit_type = nuUnspecified;
    local_f50.super_NALUnit.nal_ref_idc = 0;
    local_f50.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
    local_f50.super_NALUnit.m_nalBufferLen = 0;
    local_f50.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_002404a0;
    local_f50.pic_struct = '\0';
    local_f50.m_processedMessages._M_h._M_bucket_count = 1;
    local_f50.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_f50.m_processedMessages._M_h._M_element_count = 0;
    local_f50.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    memset(&local_f50.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
    local_f50.number_of_offset_sequences = -1;
    local_f50.metadataPtsOffset = 0;
    local_f50.m_mvcHeaderLen = 0;
    local_f50.m_mvcHeaderStart = (uint8_t *)0x0;
    end = NALUnit::findNALWithStartCode
                    (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
    puVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    if (puVar2 < end + 4 || end == puVar2) {
      bVar3 = false;
      iVar7 = -10;
    }
    else {
      local_f50.pic_struct = -1;
      NALUnit::decodeBuffer(&local_f50.super_NALUnit,buff,end);
      uVar6 = 1;
      if (this->orig_hrd_parameters_present_flag == false) {
        uVar6 = (uint)this->orig_vcl_parameters_present_flag;
      }
      SEIUnit::deserialize
                (&local_f50,
                 (SPSUnit *)
                 (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent,
                 uVar6);
      if (local_f50.m_processedMessages._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
        bVar4 = 0;
        bVar5 = 0;
      }
      else {
        bVar5 = 0;
        bVar4 = 0;
        _Var8._M_nxt = local_f50.m_processedMessages._M_h._M_before_begin._M_nxt;
        do {
          iVar7 = *(int *)&_Var8._M_nxt[1]._M_nxt;
          if (iVar7 == 0) {
LAB_00188746:
            bVar5 = 1;
          }
          else if (iVar7 != 0x25) {
            if (iVar7 == 1) {
              this->m_lastPictStruct = local_f50.pic_struct;
              goto LAB_00188746;
            }
            bVar4 = 1;
          }
          _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
        } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
      }
      if (this->m_mvcSubStream != false) {
        if (-1 < local_f50.number_of_offset_sequences) {
          if (this->m_needSeiCorrection == true) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&this->m_bdRomMetaDataMsg,(ulong)local_f50.super_NALUnit.m_nalBufferLen);
            this->m_bdRomMetaDataMsgPtsPos = local_f50.metadataPtsOffset;
            memcpy((this->m_bdRomMetaDataMsg).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,local_f50.super_NALUnit.m_nalBuffer,
                   (ulong)local_f50.super_NALUnit.m_nalBufferLen);
          }
          else {
            this->m_priorityNalAddr = buff;
            this->m_OffsetMetadataPtsAddr = buff + local_f50.metadataPtsOffset;
          }
        }
        if ((bool)(0 < local_f50.m_mvcHeaderLen & bVar5)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&this->m_lastSeiMvcHeader,(ulong)(uint)local_f50.m_mvcHeaderLen);
          memcpy((this->m_lastSeiMvcHeader).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,local_f50.m_mvcHeaderStart,
                 (long)local_f50.m_mvcHeaderLen);
        }
      }
      iVar7 = 0;
      if ((bool)(bVar5 & bVar4)) {
        bVar3 = true;
        iVar7 = 0;
        if (this->m_needSeiCorrection == true) {
          SEIUnit::removePicTimingSEI
                    (&local_f50,
                     (SPSUnit *)
                     (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                     _M_parent);
          uVar6 = NALUnit::serializeBuffer(&local_f50.super_NALUnit,local_c38,local_38,false);
          if (uVar6 == 0xffffffff) {
            std::__cxx11::ostringstream::ostringstream(local_db0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_db0,"Not enough buffer",0x11);
            puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar9 = 3;
            *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
            if (local_f70 == &local_f60) {
              puVar9[6] = local_f60;
              puVar9[7] = uStack_f5c;
              puVar9[8] = uStack_f58;
              puVar9[9] = uStack_f54;
            }
            else {
              *(uint **)(puVar9 + 2) = local_f70;
              *(ulong *)(puVar9 + 6) = CONCAT44(uStack_f5c,local_f60);
            }
            *(undefined8 *)(puVar9 + 4) = local_f68;
            local_f68 = 0;
            local_f60 = local_f60 & 0xffffff00;
            local_f70 = &local_f60;
            __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if ((int)uVar6 < 3) {
            __assert_fail("newSize > 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/h264StreamReader.cpp"
                          ,0x3e6,"int H264StreamReader::processSEI(uint8_t *)");
          }
          iVar7 = ((int)buff - (int)end) + uVar6;
          if (iVar7 != 0) {
            puVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
            if ((this->super_MPEGStreamReader).m_tmpBuffer + 0x800000 < puVar2 + iVar7) {
              std::__cxx11::ostringstream::ostringstream(local_db0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_db0,"Not enough buffer",0x11);
              puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar9 = 3;
              *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
              if (local_f90 == &local_f80) {
                puVar9[6] = local_f80;
                puVar9[7] = uStack_f7c;
                puVar9[8] = uStack_f78;
                puVar9[9] = uStack_f74;
              }
              else {
                *(uint **)(puVar9 + 2) = local_f90;
                *(ulong *)(puVar9 + 6) = CONCAT44(uStack_f7c,local_f80);
              }
              *(undefined8 *)(puVar9 + 4) = local_f88;
              local_f80 = local_f80 & 0xffffff00;
              __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            memmove(end + iVar7,end,(long)puVar2 - (long)end);
            ppuVar1 = &(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
            *ppuVar1 = *ppuVar1 + iVar7;
          }
          memcpy(buff,local_c38,(ulong)uVar6);
          iVar7 = 0;
        }
      }
      else {
        bVar3 = (bool)(bVar5 ^ 1 | bVar4);
      }
    }
    SEIUnit::~SEIUnit(&local_f50);
    if (!bVar3) {
      return iVar7;
    }
  }
  return 0;
}

Assistant:

bool H264StreamReader::findPPSForward(uint8_t *buff)
{
    bool spsFound = false;
    bool ppsFound = false;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, m_bufEnd); nal != m_bufEnd;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSPS:
        case NALUnit::NALType::nuSubSPS:
            processSPS(nal);
            spsFound = true;
            break;
        case NALUnit::NALType::nuPPS:
            processPPS(nal);
            ppsFound = true;
            break;
        default:
            break;
        }
    return spsFound && ppsFound;
}